

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O2

void Abc_TruthNpnPerform(Abc_TtStore_t *p,int NpnType,int fVerbose)

{
  uint uVar1;
  abctime aVar2;
  permInfo *x;
  abctime aVar3;
  Abc_TtMan_t *p_00;
  char *pcVar4;
  char *pcVar5;
  int level;
  ulong uVar6;
  char pCanonPerm [16];
  uint pAux [2048];
  word pAuxWord1 [1024];
  
  aVar2 = Abc_Clock();
  if (NpnType == 0) {
    pcVar5 = "uniqifying         ";
LAB_0025f253:
    if (0x10 < p->nVars) {
LAB_0025f749:
      __assert_fail("p->nVars <= 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                    ,0xcc,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
    pcVar4 = "s";
    if (p->nFuncs == 1) {
      pcVar4 = "";
    }
    printf("Applying %-20s to %8d func%s of %2d vars...  ",pcVar5,(ulong)(uint)p->nFuncs,pcVar4);
  }
  else {
    if ((uint)NpnType < 8) {
      pcVar5 = &DAT_006f001c + *(int *)(&DAT_006f0018 + (long)NpnType * 4);
      goto LAB_0025f253;
    }
    if (0x10 < p->nVars) goto LAB_0025f749;
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  if (NpnType == 0) {
    for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar6 & 0xffffffff);
        Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
        putchar(10);
      }
    }
  }
  else {
    switch(NpnType) {
    case 1:
      Abc_TruthNpnCountUnique(p);
      x = setPermInfoPtr(p->nVars);
      for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
        if (fVerbose == 0) {
          simpleMinimal(p->pFuncs[uVar6],(word *)pAux,pAuxWord1,x,p->nVars);
        }
        else {
          printf("%7d : ",uVar6 & 0xffffffff);
          simpleMinimal(p->pFuncs[uVar6],(word *)pAux,pAuxWord1,x,p->nVars);
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(pCanonPerm,0,p->nVars);
          putchar(10);
        }
      }
      freePermInfoPtr(x);
      break;
    case 2:
      for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        resetPCanonPermArray(pCanonPerm,p->nVars);
        uVar1 = Kit_TruthSemiCanonicize((uint *)p->pFuncs[uVar6],pAux,p->nVars,pCanonPerm);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
          putchar(10);
        }
      }
      break;
    case 3:
      for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        resetPCanonPermArray(pCanonPerm,p->nVars);
        uVar1 = luckyCanonicizer_final_fast(p->pFuncs[uVar6],p->nVars,pCanonPerm);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
          putchar(10);
        }
      }
      break;
    case 4:
      for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        resetPCanonPermArray(pCanonPerm,p->nVars);
        uVar1 = luckyCanonicizer_final_fast1(p->pFuncs[uVar6],p->nVars,pCanonPerm);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
          putchar(10);
        }
      }
      break;
    case 5:
      for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        uVar1 = Abc_TtCanonicize(p->pFuncs[uVar6],p->nVars,pCanonPerm);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint(pCanonPerm,uVar1,p->nVars);
          putchar(10);
        }
      }
      break;
    case 6:
      for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
        if (fVerbose != 0) {
          printf("%7d : ",uVar6 & 0xffffffff);
        }
        uVar1 = Abc_TtCanonicizePhase(p->pFuncs[uVar6],p->nVars);
        if (fVerbose != 0) {
          Extra_PrintHex(_stdout,(uint *)p->pFuncs[uVar6],p->nVars);
          Abc_TruthNpnPrint((char *)0x0,uVar1,p->nVars);
          putchar(10);
        }
      }
      break;
    case 7:
      p_00 = Abc_TtManStart(p->nVars);
      for (uVar6 = 0; (long)uVar6 < (long)p->nFuncs; uVar6 = uVar6 + 1) {
        if (fVerbose == 0) {
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar6],p->nVars,pCanonPerm);
        }
        else {
          printf("%7d : ",uVar6 & 0xffffffff);
          Abc_TtCanonicizeHie(p_00,p->pFuncs[uVar6],p->nVars,pCanonPerm);
          putchar(10);
        }
      }
      uVar1 = Abc_TtManNumClasses(p_00);
      Abc_TtManStop(p_00);
      goto LAB_0025f5e1;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                    ,0x13a,"void Abc_TruthNpnPerform(Abc_TtStore_t *, int, int)");
    }
  }
  uVar1 = 0xffffffff;
LAB_0025f5e1:
  aVar3 = Abc_Clock();
  if (uVar1 == 0xffffffff) {
    uVar1 = Abc_TruthNpnCountUnique(p);
  }
  level = 0x6f0268;
  printf("Classes =%9d  ",(ulong)uVar1);
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthNpnPerform( Abc_TtStore_t * p, int NpnType, int fVerbose )
{
    unsigned pAux[2048];
    word pAuxWord[1024], pAuxWord1[1024];
    char pCanonPerm[16];
    unsigned uCanonPhase=0;
    abctime clk = Abc_Clock();
    int i, nClasses = -1;

    char * pAlgoName = NULL;
    if ( NpnType == 0 )
        pAlgoName = "uniqifying         ";
    else if ( NpnType == 1 )
        pAlgoName = "exact NPN          ";
    else if ( NpnType == 2 )
        pAlgoName = "counting 1s        ";
    else if ( NpnType == 3 )
        pAlgoName = "Jake's hybrid fast ";
    else if ( NpnType == 4 )
        pAlgoName = "Jake's hybrid good ";
    else if ( NpnType == 5 )
        pAlgoName = "new hybrid fast    ";
    else if ( NpnType == 6 )
        pAlgoName = "new phase flipping ";
    else if ( NpnType == 7 )
        pAlgoName = "new hier. matching ";

    assert( p->nVars <= 16 );
    if ( pAlgoName )
        printf( "Applying %-20s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( NpnType == 0 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), printf( "\n" );
        }
    }
    else if ( NpnType == 1 )
    {
        permInfo* pi; 
        Abc_TruthNpnCountUnique(p);
        pi = setPermInfoPtr(p->nVars);
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            simpleMinimal(p->pFuncs[i], pAuxWord, pAuxWord1, pi, p->nVars);
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
        freePermInfoPtr(pi);
    }
    else if ( NpnType == 2 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pFuncs[i], pAux, p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 3 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 4 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            resetPCanonPermArray(pCanonPerm, p->nVars);
            uCanonPhase = luckyCanonicizer_final_fast1( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicize( p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(pCanonPerm, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 6 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizePhase( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
        }
    }
    else if ( NpnType == 7 )
    {
        extern unsigned Abc_TtCanonicizeHie( Abc_TtMan_t * p, word * pTruth, int nVars, char * pCanonPerm );
        extern Abc_TtMan_t * Abc_TtManStart( int nVars );
        extern void Abc_TtManStop( Abc_TtMan_t * p );
        extern int Abc_TtManNumClasses( Abc_TtMan_t * p );

        Abc_TtMan_t * pMan = Abc_TtManStart( p->nVars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d : ", i );
            uCanonPhase = Abc_TtCanonicizeHie( pMan, p->pFuncs[i], p->nVars, pCanonPerm );
            if ( fVerbose )
//                Extra_PrintHex( stdout, (unsigned *)p->pFuncs[i], p->nVars ), Abc_TruthNpnPrint(NULL, uCanonPhase, p->nVars), printf( "\n" );
                printf( "\n" );
        }
        nClasses = Abc_TtManNumClasses( pMan );
        Abc_TtManStop( pMan );
    }
    else assert( 0 );
    clk = Abc_Clock() - clk;
    printf( "Classes =%9d  ", nClasses == -1 ? Abc_TruthNpnCountUnique(p) : nClasses );
    Abc_PrintTime( 1, "Time", clk );
}